

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NamedPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedPortConnectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::PropertyExprSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,PropertyExprSyntax **args_4,Token *args_5)

{
  Info *pIVar1;
  Info *pIVar2;
  PropertyExprSyntax *pPVar3;
  size_type sVar4;
  pointer ppAVar5;
  Info *pIVar6;
  Info *pIVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  TokenKind TVar22;
  undefined1 uVar23;
  NumericTokenFlags NVar24;
  uint32_t uVar25;
  NamedPortConnectionSyntax *pNVar26;
  long lVar27;
  
  pNVar26 = (NamedPortConnectionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NamedPortConnectionSyntax *)this->endPtr < pNVar26 + 1) {
    pNVar26 = (NamedPortConnectionSyntax *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(pNVar26 + 1);
  }
  TVar10 = args_1->kind;
  uVar11 = args_1->field_0x2;
  NVar12.raw = (args_1->numFlags).raw;
  uVar13 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar14 = args_2->kind;
  uVar15 = args_2->field_0x2;
  NVar16.raw = (args_2->numFlags).raw;
  uVar17 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar18 = args_3->kind;
  uVar19 = args_3->field_0x2;
  NVar20.raw = (args_3->numFlags).raw;
  uVar21 = args_3->rawLen;
  pIVar6 = args_3->info;
  pPVar3 = *args_4;
  TVar22 = args_5->kind;
  uVar23 = args_5->field_0x2;
  NVar24.raw = (args_5->numFlags).raw;
  uVar25 = args_5->rawLen;
  pIVar7 = args_5->info;
  (pNVar26->super_PortConnectionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pNVar26->super_PortConnectionSyntax).super_SyntaxNode.kind = NamedPortConnection;
  SVar8 = (args->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pNVar26->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pNVar26->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       SVar8;
  *(undefined4 *)
   &(pNVar26->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc
       = uVar9;
  (pNVar26->super_PortConnectionSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (pNVar26->super_PortConnectionSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar4 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).size_
  ;
  (pNVar26->super_PortConnectionSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).data_;
  (pNVar26->super_PortConnectionSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar4;
  (pNVar26->super_PortConnectionSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea348;
  (pNVar26->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pNVar26;
  sVar4 = (pNVar26->super_PortConnectionSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar4 != 0) {
    ppAVar5 = (pNVar26->super_PortConnectionSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar27 = 0;
    do {
      **(undefined8 **)((long)ppAVar5 + lVar27) = pNVar26;
      lVar27 = lVar27 + 8;
    } while (sVar4 << 3 != lVar27);
  }
  (pNVar26->dot).kind = TVar10;
  (pNVar26->dot).field_0x2 = uVar11;
  (pNVar26->dot).numFlags = (NumericTokenFlags)NVar12.raw;
  (pNVar26->dot).rawLen = uVar13;
  (pNVar26->dot).info = pIVar1;
  (pNVar26->name).kind = TVar14;
  (pNVar26->name).field_0x2 = uVar15;
  (pNVar26->name).numFlags = (NumericTokenFlags)NVar16.raw;
  (pNVar26->name).rawLen = uVar17;
  (pNVar26->name).info = pIVar2;
  (pNVar26->openParen).kind = TVar18;
  (pNVar26->openParen).field_0x2 = uVar19;
  (pNVar26->openParen).numFlags = (NumericTokenFlags)NVar20.raw;
  (pNVar26->openParen).rawLen = uVar21;
  (pNVar26->openParen).info = pIVar6;
  pNVar26->expr = pPVar3;
  (pNVar26->closeParen).kind = TVar22;
  (pNVar26->closeParen).field_0x2 = uVar23;
  (pNVar26->closeParen).numFlags = (NumericTokenFlags)NVar24.raw;
  (pNVar26->closeParen).rawLen = uVar25;
  (pNVar26->closeParen).info = pIVar7;
  if (pPVar3 != (PropertyExprSyntax *)0x0) {
    (pPVar3->super_SyntaxNode).parent = (SyntaxNode *)pNVar26;
  }
  return pNVar26;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }